

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QStringView>::emplace<QStringView>
          (QPodArrayOps<QStringView> *this,qsizetype i,QStringView *args)

{
  QStringView **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  storage_type_conflict *psVar4;
  qsizetype qVar5;
  QStringView *pQVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QStringView>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QStringView>).size == i) &&
       (qVar5 = QArrayDataPointer<QStringView>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QStringView>), qVar5 != 0)) {
      qVar5 = args->m_size;
      pQVar6 = (this->super_QArrayDataPointer<QStringView>).ptr +
               (this->super_QArrayDataPointer<QStringView>).size;
      pQVar6->m_data = args->m_data;
      pQVar6->m_size = qVar5;
    }
    else {
      if ((i != 0) ||
         (qVar5 = QArrayDataPointer<QStringView>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QStringView>), qVar5 == 0))
      goto LAB_00150834;
      pQVar6 = (this->super_QArrayDataPointer<QStringView>).ptr;
      qVar5 = args->m_size;
      pQVar6[-1].m_data = args->m_data;
      pQVar6[-1].m_size = qVar5;
      ppQVar1 = &(this->super_QArrayDataPointer<QStringView>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QStringView>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_00150834:
  psVar4 = args->m_data;
  qVar5 = args->m_size;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QStringView>).size != 0);
  QArrayDataPointer<QStringView>::detachAndGrow
            (&this->super_QArrayDataPointer<QStringView>,where,1,(QStringView **)0x0,
             (QArrayDataPointer<QStringView> *)0x0);
  pQVar6 = createHole(this,where,i,1);
  pQVar6->m_data = psVar4;
  pQVar6->m_size = qVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }